

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Hes_Emu::run_clocks(Hes_Emu *this,blip_time_t *duration_,int param_2)

{
  int end_time;
  bool bVar1;
  int iVar2;
  int iVar3;
  
  end_time = *duration_;
  bVar1 = Hes_Cpu::run(&this->super_Hes_Cpu,end_time);
  if (bVar1) {
    (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ =
         "Emulation error (illegal instruction)";
  }
  run_until(this,end_time);
  (this->timer).last_time = (this->timer).last_time - end_time;
  (this->vdp).next_vbl = (this->vdp).next_vbl - end_time;
  Hes_Cpu::end_frame(&this->super_Hes_Cpu,end_time);
  iVar2 = (this->irq).timer;
  if (iVar2 < 0x40000000) {
    iVar2 = iVar2 - end_time;
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    (this->irq).timer = iVar3;
  }
  iVar2 = (this->irq).vdp;
  if (iVar2 < 0x40000000) {
    iVar2 = iVar2 - end_time;
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    (this->irq).vdp = iVar3;
  }
  Hes_Apu::end_frame(&this->apu,end_time);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Hes_Emu::run_clocks( blip_time_t& duration_, int )
{
	blip_time_t const duration = duration_; // cache
	
	if ( cpu::run( duration ) )
		set_warning( "Emulation error (illegal instruction)" );
	
	check( time() >= duration );
	//check( time() - duration < 20 ); // Txx instruction could cause going way over
	
	run_until( duration );
	
	// end time frame
	timer.last_time -= duration;
	vdp.next_vbl    -= duration;
	#if GME_FRAME_HOOK_DEFINED
		last_frame_hook -= duration;
	#endif
	cpu::end_frame( duration );
	::adjust_time( irq.timer, duration );
	::adjust_time( irq.vdp,   duration );
	apu.end_frame( duration );
	
	return 0;
}